

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O3

void __thiscall
ByteData256_BytesConstructor_Test::~ByteData256_BytesConstructor_Test
          (ByteData256_BytesConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData256, BytesConstructor) {
  std::vector<uint8_t> target(32);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData256 byte_data = ByteData256(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "0102030405060708090001020304050607080900010203040506070809000102");
  EXPECT_TRUE(is_equals);
}